

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

void __thiscall
wabt::ObjdumpLocalNames::Set
          (ObjdumpLocalNames *this,Index function_index,Index param_2,string_view name)

{
  mapped_type *this_00;
  pair<unsigned_int,_unsigned_int> local_54;
  allocator<char> local_49;
  string local_48 [32];
  Index local_28;
  Index local_24;
  Index local_index_local;
  Index function_index_local;
  ObjdumpLocalNames *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (ObjdumpLocalNames *)name._M_len;
  local_28 = param_2;
  local_24 = function_index;
  _local_index_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_48,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_49);
  std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_int_&,_true>
            (&local_54,&local_24,&local_28);
  this_00 = std::
            map<std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->names,&local_54);
  std::__cxx11::string::operator=((string *)this_00,local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

void ObjdumpLocalNames::Set(Index function_index,
                            Index local_index,
                            std::string_view name) {
  names[std::pair<Index, Index>(function_index, local_index)] =
      std::string(name);
}